

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct16_stage7_avx2(__m256i *output,__m256i *x1)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  
  alVar1 = *x1;
  alVar2 = x1[0xf];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  *output = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xf] = alVar1;
  alVar1 = x1[1];
  alVar2 = x1[0xe];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[1] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xe] = alVar1;
  alVar1 = x1[2];
  alVar2 = x1[0xd];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[2] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xd] = alVar1;
  alVar1 = x1[3];
  alVar2 = x1[0xc];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[3] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xc] = alVar1;
  alVar1 = x1[4];
  alVar2 = x1[0xb];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[4] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[0xb] = alVar1;
  alVar1 = x1[5];
  alVar2 = x1[10];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[5] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[10] = alVar1;
  alVar1 = x1[6];
  alVar2 = x1[9];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[6] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[9] = alVar1;
  alVar1 = x1[7];
  alVar2 = x1[8];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[7] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
  output[8] = alVar1;
  return;
}

Assistant:

static inline void idct16_stage7_avx2(__m256i *output, __m256i *x1) {
  btf_16_adds_subs_out_avx2(&output[0], &output[15], x1[0], x1[15]);
  btf_16_adds_subs_out_avx2(&output[1], &output[14], x1[1], x1[14]);
  btf_16_adds_subs_out_avx2(&output[2], &output[13], x1[2], x1[13]);
  btf_16_adds_subs_out_avx2(&output[3], &output[12], x1[3], x1[12]);
  btf_16_adds_subs_out_avx2(&output[4], &output[11], x1[4], x1[11]);
  btf_16_adds_subs_out_avx2(&output[5], &output[10], x1[5], x1[10]);
  btf_16_adds_subs_out_avx2(&output[6], &output[9], x1[6], x1[9]);
  btf_16_adds_subs_out_avx2(&output[7], &output[8], x1[7], x1[8]);
}